

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_enc.c
# Opt level: O1

void VP8IteratorReset(VP8EncIterator *it)

{
  VP8Encoder *pVVar1;
  int iVar2;
  
  pVVar1 = it->enc_;
  VP8IteratorSetRow(it,0);
  iVar2 = pVVar1->mb_h_ * pVVar1->mb_w_;
  it->count_down0_ = iVar2;
  it->count_down_ = iVar2;
  pVVar1 = it->enc_;
  memset(pVVar1->y_top_,0x7f,(long)pVVar1->mb_w_ << 5);
  memset(pVVar1->nz_,0,(long)pVVar1->mb_w_ << 2);
  if (pVVar1->top_derr_ != (DError *)0x0) {
    memset(pVVar1->top_derr_,0,(long)pVVar1->mb_w_ << 2);
  }
  it->bit_count_[3][1] = 0;
  it->bit_count_[3][2] = 0;
  it->bit_count_[2][2] = 0;
  it->bit_count_[3][0] = 0;
  it->bit_count_[2][0] = 0;
  it->bit_count_[2][1] = 0;
  it->bit_count_[1][1] = 0;
  it->bit_count_[1][2] = 0;
  it->bit_count_[0][2] = 0;
  it->bit_count_[1][0] = 0;
  it->bit_count_[0][0] = 0;
  it->bit_count_[0][1] = 0;
  it->do_trellis_ = 0;
  return;
}

Assistant:

void VP8IteratorReset(VP8EncIterator* const it) {
  VP8Encoder* const enc = it->enc_;
  VP8IteratorSetRow(it, 0);
  VP8IteratorSetCountDown(it, enc->mb_w_ * enc->mb_h_);  // default
  InitTop(it);
  memset(it->bit_count_, 0, sizeof(it->bit_count_));
  it->do_trellis_ = 0;
}